

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcIsExtensionPresent(void)

{
  ALCboolean retval_00;
  ALCdevice *device_00;
  char *extname_00;
  ALCboolean retval;
  ALCchar *extname;
  ALCdevice *device;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&device);
  if (io_failure == 0) {
    device_00 = (ALCdevice *)IO_PTR();
    extname_00 = IO_STRING();
    retval_00 = IO_ALCBOOLEAN();
    if (io_failure == 0) {
      visit_alcIsExtensionPresent((CallerInfo *)&device,retval_00,device_00,extname_00);
    }
  }
  return;
}

Assistant:

static void decode_alcIsExtensionPresent(void)
{
    IO_START(alcIsExtensionPresent);
    ALCdevice *device = (ALCdevice *) IO_PTR();
    const ALCchar *extname = (const ALCchar *) IO_STRING();
    const ALCboolean retval = IO_ALCBOOLEAN();
    if (!io_failure) visit_alcIsExtensionPresent(&callerinfo, retval, device, extname);
    IO_END();
}